

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

QSize __thiscall QDockWidgetItem::maximumSize(QDockWidgetItem *this)

{
  QLayoutItem *pQVar1;
  long in_FS_OFFSET;
  QDockWidgetLayout *unaff_retaddr;
  QLayoutItem *item;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize *in_stack_ffffffffffffffc0;
  QSize in_stack_fffffffffffffff0;
  undefined1 floating;
  QSize *content;
  
  content = *(QSize **)(in_FS_OFFSET + 0x28);
  pQVar1 = dockWidgetChildItem((QDockWidgetItem *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (pQVar1 == (QLayoutItem *)0x0) {
    QSize::QSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  else {
    dockWidgetLayout((QDockWidgetItem *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    floating = in_stack_fffffffffffffff0.ht.m_i._3_1_;
    (*pQVar1->_vptr_QLayoutItem[4])();
    in_stack_fffffffffffffff0 =
         QDockWidgetLayout::sizeFromContent(unaff_retaddr,content,(bool)floating);
  }
  if (*(QSize **)(in_FS_OFFSET + 0x28) == content) {
    return in_stack_fffffffffffffff0;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetItem::maximumSize() const
{
    if (QLayoutItem *item = dockWidgetChildItem()) {
        return dockWidgetLayout()->sizeFromContent(item->maximumSize(), false);
    } else {
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
    }
}